

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void skewness_api_suite::test_clear(void)

{
  undefined4 local_6c;
  size_type local_68;
  undefined4 local_5c;
  size_type local_58 [2];
  undefined1 local_48 [8];
  moment_skewness<double,_4> filter;
  
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)3>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)3> *)local_48);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             1.0);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             2.0);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             3.0);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             4.0);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             5.0);
  local_58[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::size
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>
                            *)local_48);
  local_5c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1c7,"void skewness_api_suite::test_clear()",local_58,&local_5c);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::clear
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48);
  local_68 = trial::online::interim::detail::
             basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *
                        )local_48);
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1c9,"void skewness_api_suite::test_clear()",&local_68,&local_6c);
  return;
}

Assistant:

void test_clear()
{
    interim::moment_skewness<double, 4> filter;
    filter.push(1.0);
    filter.push(2.0);
    filter.push(3.0);
    filter.push(4.0);
    filter.push(5.0);
    TRIAL_TEST_EQ(filter.size(), 4);
    filter.clear();
    TRIAL_TEST_EQ(filter.size(), 0);
}